

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O3

void __thiscall
cppnet::RWSocket::RWSocket(RWSocket *this,uint64_t sock,shared_ptr<cppnet::AlloterWrap> *alloter)

{
  shared_ptr<cppnet::AlloterWrap> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *this_00;
  AlloterWrap local_38;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__Socket_001252f8;
  (this->super_Socket)._sock = sock;
  Address::Address(&(this->super_Socket)._addr);
  (this->super_Socket)._dispatcher.super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_Socket)._dispatcher.super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Socket)._event_actions.
  super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Socket)._event_actions.
  super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Socket)._cppnet_base.super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_Socket)._cppnet_base.super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
  super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
  super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_001253b8;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&PTR__RWSocket_00125478;
  psVar1 = &this->_alloter;
  this->_context = (void *)0x0;
  this->_timer_id = 0;
  this->_listen_port = 0;
  this->_shutdown = (__atomic_base<bool>)0x0;
  this->_connecting = (__atomic_base<bool>)0x0;
  this->_event = (Event *)0x0;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (alloter->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  p_Var2 = (alloter->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      this_00 = (psVar1->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_block_pool).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->_block_pool).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       AlloterWrap::PoolNew<cppnet::BlockMemoryPool,unsigned_short_const&,unsigned_short_const&>
                 (this_00,&__mem_block_size,&__mem_block_add_step);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::BlockMemoryPool*,cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BlockMemoryPool,unsigned_short_const&,unsigned_short_const&>(unsigned_short_const&,unsigned_short_const&)::_lambda(cppnet::BlockMemoryPool*)_1_,std::allocator<void>,void>
            (&local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,this_00);
  _Var4._M_pi = local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar3 = local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->_block_pool).
           super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->_block_pool).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)peVar3;
  (this->_block_pool).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  AlloterWrap::
  PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
            (&local_38,
             (shared_ptr<cppnet::BlockMemoryPool> *)
             (psVar1->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (shared_ptr<cppnet::AlloterWrap> *)&this->_block_pool);
  _Var4._M_pi = local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar3 = local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar3;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  AlloterWrap::
  PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
            (&local_38,
             (shared_ptr<cppnet::BlockMemoryPool> *)
             (psVar1->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (shared_ptr<cppnet::AlloterWrap> *)&this->_block_pool);
  _Var4._M_pi = local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar3 = local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar3;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

RWSocket::RWSocket(uint64_t sock, std::shared_ptr<AlloterWrap> alloter):
    Socket(sock),
    _context(nullptr),
    _timer_id(0),
    _listen_port(0),
    _shutdown(false),
    _connecting(false),
    _event(nullptr),
    _alloter(alloter) {

    _block_pool = _alloter->PoolNewSharePtr<BlockMemoryPool>(__mem_block_size, __mem_block_add_step);

    _write_buffer = _alloter->PoolNewSharePtr<BufferQueue>(_block_pool, _alloter);
    _read_buffer = _alloter->PoolNewSharePtr<BufferQueue>(_block_pool, _alloter);
}